

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Point2f __thiscall pbrt::PMJ02BNSampler::Get2D(PMJ02BNSampler *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  BasicOptions *pBVar4;
  Tuple2<pbrt::Point2,_float> *pTVar5;
  float *pfVar6;
  PMJ02BNSampler *in_RDI;
  float x;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Point2f u;
  Vector2f cpOffset;
  int offset;
  uint64_t hash;
  int pmjInstance;
  int index;
  float in_stack_ffffffffffffff98;
  float y;
  int in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  Point2<float> *this_00;
  undefined8 local_3c;
  Point2<float> local_34;
  Tuple2<pbrt::Point2,_int> local_2c;
  int local_24;
  uint64_t local_20;
  int local_18;
  int local_14;
  Tuple2<pbrt::Point2,_float> local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_14 = in_RDI->sampleIndex;
  local_18 = in_RDI->dimension;
  if (4 < local_18) {
    iVar1 = (in_RDI->pixel).super_Tuple2<pbrt::Point2,_int>.x;
    iVar2 = (in_RDI->pixel).super_Tuple2<pbrt::Point2,_int>.y;
    iVar3 = in_RDI->dimension;
    pBVar4 = GetOptions();
    local_20 = MixBits((long)iVar1 << 0x30 ^ (long)iVar2 << 0x20 ^ (long)iVar3 << 0x10 ^
                       (long)pBVar4->seed);
    local_14 = PermutationElement(in_RDI->sampleIndex,in_RDI->samplesPerPixel,(uint32_t)local_20);
  }
  if (in_RDI->dimension == 0) {
    local_2c = (in_RDI->pixel).super_Tuple2<pbrt::Point2,_int>;
    local_24 = pixelSampleOffset(in_RDI,(Point2i)local_2c);
    in_RDI->dimension = in_RDI->dimension + 2;
    pTVar5 = &pstd::
              vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>::
              operator[](in_RDI->pixelSamples,(long)(local_24 + local_14))->
              super_Tuple2<pbrt::Point2,_float>;
    local_8 = *pTVar5;
  }
  else {
    x = BlueNoise((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0,
                  in_stack_ffffffffffffff9c);
    BlueNoise((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0,(int)x)
    ;
    this_00 = &local_34;
    Vector2<float>::Vector2((Vector2<float> *)this_00,x,in_stack_ffffffffffffff98);
    auVar7._0_8_ = GetPMJ02BNSample((int)x,(int)in_stack_ffffffffffffff98);
    auVar7._8_56_ = extraout_var;
    vmovlpd_avx(auVar7._0_16_);
    auVar8._0_8_ = Point2<float>::operator+
                             ((Point2<float> *)CONCAT44(x,in_stack_ffffffffffffff98),
                              (Vector2<float> *)0x6d3694);
    auVar8._8_56_ = extraout_var_00;
    local_3c = vmovlpd_avx(auVar8._0_16_);
    if (1.0 <= (float)local_3c) {
      local_3c._4_4_ = (float)((ulong)local_3c >> 0x20);
      local_3c = CONCAT44(local_3c._4_4_,(float)local_3c - 1.0);
    }
    if (1.0 <= local_3c._4_4_) {
      local_3c = CONCAT44(local_3c._4_4_ - 1.0,(float)local_3c);
    }
    in_RDI->dimension = in_RDI->dimension + 2;
    pfVar6 = std::min<float>((float *)&local_3c,(float *)&OneMinusEpsilon);
    y = *pfVar6;
    std::min<float>((float *)((long)&local_3c + 4),(float *)&OneMinusEpsilon);
    Point2<float>::Point2(this_00,x,y);
  }
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Don't start permuting until the second time through: when we
        // permute, that breaks the progressive part of the pattern and in
        // turn, convergence is similar to random until the very end. This way,
        // we generally do well for intermediate images as well.
        int index = sampleIndex;
        int pmjInstance = dimension;
        if (pmjInstance >= nPMJ02bnSets) {
            uint64_t hash =
                MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                        ((uint64_t)dimension << 16) ^ GetOptions().seed);
            index = PermutationElement(sampleIndex, samplesPerPixel, hash);
        }

        if (dimension == 0) {
            // special case the pixel sample
            int offset = pixelSampleOffset(Point2i(pixel));
            dimension += 2;
            return (*pixelSamples)[offset + index];
        } else {
            Vector2f cpOffset(BlueNoise(dimension, pixel.x, pixel.y),
                              BlueNoise(dimension + 1, pixel.x, pixel.y));
            Point2f u = GetPMJ02BNSample(pmjInstance % nPMJ02bnSets, index) + cpOffset;
            if (u.x >= 1)
                u.x -= 1;
            if (u.y >= 1)
                u.y -= 1;
            dimension += 2;
            return {std::min(u.x, OneMinusEpsilon), std::min(u.y, OneMinusEpsilon)};
        }
    }